

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

bool __thiscall MeCab::Writer::writeNode(Writer *this,Lattice *lattice,Node *node,StringBuffer *os)

{
  bool bVar1;
  
  if ((ulong)node->stat < 5) {
    bVar1 = writeNode(this,lattice,
                      *(char **)((long)&this->_vptr_Writer +
                                *(long *)(&DAT_00151568 + (ulong)node->stat * 8)),node,os);
    return bVar1;
  }
  return true;
}

Assistant:

bool Writer::writeNode(Lattice *lattice, const Node *node,
                       StringBuffer *os) const {
  switch (node->stat) {
    case MECAB_BOS_NODE:
      return writeNode(lattice, bos_format_.get(), node, os);
    case MECAB_EOS_NODE:
      return writeNode(lattice, eos_format_.get(), node, os);
    case MECAB_UNK_NODE:
      return writeNode(lattice, unk_format_.get(), node, os);
    case MECAB_NOR_NODE:
      return writeNode(lattice, node_format_.get(), node, os);
    case MECAB_EON_NODE:
      return writeNode(lattice, eon_format_.get(), node, os);
  }
  return true;
}